

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value.c
# Opt level: O0

value value_from(value v,void *data,size_t bytes)

{
  void *__s;
  size_t in_RDX;
  void *in_RSI;
  value in_RDI;
  void *dest;
  
  __s = value_data(in_RDI);
  if ((__s != (void *)0x0) && (in_RDX != 0)) {
    if (in_RSI == (void *)0x0) {
      memset(__s,0,in_RDX);
    }
    else {
      memcpy(__s,in_RSI,in_RDX);
    }
  }
  return in_RDI;
}

Assistant:

value value_from(value v, const void *data, size_t bytes)
{
	void *dest = value_data(v);

	if (dest != NULL && bytes > 0)
	{
		if (data != NULL)
		{
			memcpy(dest, data, bytes);
		}
		else
		{
			memset(dest, 0, bytes);
		}
	}

	return v;
}